

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::WeakFulfiller<kj::HttpClient::WebSocketResponse>::disposeImpl
          (WeakFulfiller<kj::HttpClient::WebSocketResponse> *this,void *pointer)

{
  PromiseFulfiller<kj::HttpClient::WebSocketResponse> *pPVar1;
  uint uVar2;
  String local_188;
  Exception local_170;
  void *local_18;
  void *pointer_local;
  WeakFulfiller<kj::HttpClient::WebSocketResponse> *this_local;
  
  local_18 = pointer;
  pointer_local = this;
  if (this->inner == (PromiseFulfiller<kj::HttpClient::WebSocketResponse> *)0x0) {
    if (this != (WeakFulfiller<kj::HttpClient::WebSocketResponse> *)0x0) {
      operator_delete(this,0x18);
    }
  }
  else {
    uVar2 = (*this->inner->_vptr_PromiseFulfiller[2])();
    if ((uVar2 & 1) != 0) {
      pPVar1 = this->inner;
      heapString(&local_188,"PromiseFulfiller was destroyed without fulfilling the promise.");
      Exception::Exception
                (&local_170,FAILED,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/../kj/async-inl.h"
                 ,0x430,&local_188);
      (*pPVar1->_vptr_PromiseFulfiller[1])(pPVar1,&local_170);
      Exception::~Exception(&local_170);
      String::~String(&local_188);
    }
    this->inner = (PromiseFulfiller<kj::HttpClient::WebSocketResponse> *)0x0;
  }
  return;
}

Assistant:

void disposeImpl(void* pointer) const override {
    // TODO(perf): Factor some of this out so it isn't regenerated for every fulfiller type?

    if (inner == nullptr) {
      // Already detached.
      delete this;
    } else {
      if (inner->isWaiting()) {
        inner->reject(kj::Exception(kj::Exception::Type::FAILED, __FILE__, __LINE__,
            kj::heapString("PromiseFulfiller was destroyed without fulfilling the promise.")));
      }
      inner = nullptr;
    }
  }